

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeLangevin::applyConstraints(FluctuatingChargeLangevin *this)

{
  DataStoragePointer DVar1;
  Snapshot *pSVar2;
  long lVar3;
  Molecule *pMVar4;
  long lVar5;
  Atom *pAVar6;
  int k;
  int iVar7;
  pointer ppAVar8;
  result_type_conflict1 rVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  MoleculeIterator i;
  MoleculeIterator local_38;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_38._M_node = (_Base_ptr)0x0;
    pMVar4 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_38);
    while (pMVar4 != (Molecule *)0x0) {
      ppAVar8 = (pMVar4->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppAVar8 !=
          (pMVar4->fluctuatingCharges_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_001d6c67;
      pAVar6 = (Atom *)0x0;
      while (pAVar6 != (Atom *)0x0) {
        rVar9 = std::normal_distribution<double>::operator()
                          (&this->forceDistribution_,
                           (this->randNumGen_).
                           super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        DVar1 = (pAVar6->super_StuntDouble).storage_;
        pSVar2 = ((pAVar6->super_StuntDouble).snapshotMan_)->currentSnapshot_;
        lVar5 = (long)(pAVar6->super_StuntDouble).localIndex_;
        lVar3 = *(long *)((long)&(pSVar2->atomData).flucQFrc.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar1);
        dVar10 = rVar9 + *(double *)(lVar3 + lVar5 * 8);
        *(double *)(lVar3 + lVar5 * 8) = dVar10;
        iVar7 = 0;
        dVar13 = dVar10;
        dVar12 = 0.0;
        while ((dVar11 = dVar12,
               iVar7 < *(int *)&(this->super_FluctuatingChargePropagator).field_0x2c &&
               (dVar11 = ((dVar13 * this->dt2_) / pAVar6->chargeMass_ +
                         *(double *)
                          (*(long *)((long)&(pSVar2->atomData).flucQVel.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start + DVar1) +
                          lVar5 * 8)) * -this->drag_, this->forceTolerance_ < ABS(dVar11 - dVar12)))
              ) {
          dVar13 = dVar10 + dVar11;
          iVar7 = iVar7 + 1;
          dVar12 = dVar11;
        }
        *(double *)(lVar3 + lVar5 * 8) = dVar10 + dVar11;
        ppAVar8 = ppAVar8 + 1;
        pAVar6 = (Atom *)0x0;
        if (ppAVar8 !=
            (pMVar4->fluctuatingCharges_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_001d6c67:
          pAVar6 = *ppAVar8;
        }
      }
      pMVar4 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_38);
    }
    FluctuatingChargeConstraints::applyConstraints
              ((this->super_FluctuatingChargePropagator).fqConstraints_);
  }
  return;
}

Assistant:

void FluctuatingChargeLangevin::applyConstraints() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass, randomForce, frictionForce;
    RealType velStep, oldFF;  // used to test for convergence

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        randomForce = forceDistribution_(*randNumGen_);
        atom->addFlucQFrc(randomForce);

        // What remains contains velocity explicitly, but the velocity
        // required is at the full step: v(t + h), while we have
        // initially the velocity at the half step: v(t + h/2).  We
        // need to iterate to converge the friction force vector.

        // this is the velocity at the half-step:

        cvel = atom->getFlucQVel();

        // estimate velocity at full-step using everything but
        // friction forces:

        cfrc    = atom->getFlucQFrc();
        cmass   = atom->getChargeMass();
        velStep = cvel + dt2_ * cfrc / cmass;

        frictionForce = 0.0;

        // iteration starts here:

        for (int k = 0; k < maxIterNum_; k++) {
          oldFF         = frictionForce;
          frictionForce = -drag_ * velStep;
          // re-estimate velocities at full-step using friction forces:

          velStep = cvel + dt2_ * (cfrc + frictionForce) / cmass;

          // check for convergence

          if (fabs(frictionForce - oldFF) <= forceTolerance_)
            break;  // iteration ends here
        }
        atom->addFlucQFrc(frictionForce);
      }
    }
    fqConstraints_->applyConstraints();
  }